

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify.cpp
# Opt level: O0

void __thiscall
embree::SphereFilterMultiHitTest::createSphere
          (SphereFilterMultiHitTest *this,RTCDevice device,RTCScene scene,float x,float y,float z,
          float r)

{
  undefined8 uVar1;
  undefined4 *puVar2;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM3_Da;
  float *vertices;
  RTCGeometry geom;
  
  uVar1 = rtcNewGeometry(in_RSI,0x32);
  puVar2 = (undefined4 *)rtcSetNewGeometryBuffer(uVar1,1,0,0x9004,0x10,1);
  *puVar2 = in_XMM0_Da;
  puVar2[1] = in_XMM1_Da;
  puVar2[2] = in_XMM2_Da;
  puVar2[3] = in_XMM3_Da;
  rtcCommitGeometry(uVar1);
  rtcAttachGeometry(in_RDX,uVar1);
  rtcReleaseGeometry(uVar1);
  return;
}

Assistant:

void createSphere(RTCDevice device, RTCScene scene, float x, float y, float z, float r)
    {
      RTCGeometry geom = rtcNewGeometry(device, RTC_GEOMETRY_TYPE_SPHERE_POINT);
      
      float* vertices = (float*)rtcSetNewGeometryBuffer(geom, RTC_BUFFER_TYPE_VERTEX, 0, RTC_FORMAT_FLOAT4, 4 * sizeof(float), 1);
      vertices[0] = x; vertices[1] = y; vertices[2] = z; vertices[3] = r;
      
      rtcCommitGeometry(geom);
      rtcAttachGeometry(scene, geom);
      rtcReleaseGeometry(geom);
    }